

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

FName __thiscall AActor::GetSpecies(AActor *this)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  FName *other;
  AActor *in_RSI;
  TFlags<ActorFlag3,_unsigned_int> local_28;
  TFlags<ActorFlag3,_unsigned_int> local_24;
  MetaClass *local_20;
  PClassActor *thistype;
  AActor *this_local;
  
  this_local = this;
  bVar1 = FName::operator!=(&(in_RSI->Species).super_FName,NAME_None);
  if (bVar1) {
    FName::FName((FName *)this,&(in_RSI->Species).super_FName);
  }
  else {
    local_20 = GetClass(in_RSI);
    pAVar3 = GetDefaultByType(&local_20->super_PClass);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_24,
               (int)pAVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
    if (uVar2 != 0) {
      for (; (local_20->super_PClass).ParentClass != (PClass *)0x0;
          local_20 = (MetaClass *)(local_20->super_PClass).ParentClass) {
        pAVar3 = GetDefaultByType((local_20->super_PClass).ParentClass);
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_28,
                   (int)pAVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
        if (uVar2 == 0) break;
      }
    }
    other = FNameNoInit::operator=
                      (&in_RSI->Species,
                       &(local_20->super_PClass).super_PStruct.super_PNamedType.TypeName);
    FName::FName((FName *)this,other);
  }
  return (FName)(int)this;
}

Assistant:

FName AActor::GetSpecies()
{
	if (Species != NAME_None)
	{
		return Species;
	}

	PClassActor *thistype = GetClass();

	if (GetDefaultByType(thistype)->flags3 & MF3_ISMONSTER)
	{
		while (thistype->ParentClass)
		{
			if (GetDefaultByType(thistype->ParentClass)->flags3 & MF3_ISMONSTER)
				thistype = static_cast<PClassActor *>(thistype->ParentClass);
			else 
				break;
		}
	}
	return Species = thistype->TypeName; // [GZ] Speeds up future calls.
}